

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddBezierCurve
          (ImDrawList *this,ImVec2 *pos0,ImVec2 *cp0,ImVec2 *cp1,ImVec2 *pos1,ImU32 col,
          float thickness,int num_segments)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  pIVar4 = GImGui;
  if (0xffffff < col) {
    iVar8 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar8 == iVar2) {
      iVar8 = iVar8 + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar8 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar2 < iVar8) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    iVar8 = (this->_Path).Size;
    (this->_Path).Size = iVar8 + 1;
    (this->_Path).Data[iVar8] = *pos0;
    PathBezierCurveTo(this,cp0,cp1,pos1,num_segments);
    uVar9 = 0;
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,thickness,true);
    pIVar4 = GImGui;
    iVar8 = (this->_Path).Capacity;
    if (iVar8 < 0) {
      uVar7 = iVar8 / 2 + iVar8;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)(uVar9 * 8);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = (int)uVar9;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCurve(const ImVec2& pos0, const ImVec2& cp0, const ImVec2& cp1, const ImVec2& pos1, ImU32 col, float thickness, int num_segments)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(pos0);
    PathBezierCurveTo(cp0, cp1, pos1, num_segments);
    PathStroke(col, false, thickness);
}